

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

int Smt_PrsBuildConstant(Wlc_Ntk_t *pNtk,char *pStr,int nBits,char *pName)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  char *__s;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  int fFound;
  
  sVar6 = (size_t)(uint)nBits;
  p = Vec_IntAlloc(10);
  if (*pStr == '#') {
    if (pStr[1] == 'x') {
      if (nBits == -1) {
        sVar6 = strlen(pStr + 2);
        sVar6 = (size_t)(uint)((int)sVar6 << 2);
      }
      iVar5 = (int)sVar6;
      iVar9 = 0;
      Vec_IntFill(p,((iVar5 >> 5) + 1) - (uint)((sVar6 & 0x1f) == 0),0);
      iVar4 = Abc_TtReadHexNumber((word *)p->pArray,pStr + 2);
      if (iVar4 != (iVar5 + 3) / 4) goto LAB_002ef907;
    }
    else {
      if (pStr[1] != 'b') {
LAB_002ef763:
        Vec_IntFree(p);
        return 0;
      }
      if (nBits == -1) {
        sVar6 = strlen(pStr + 2);
      }
      iVar5 = (int)sVar6;
      uVar11 = 0;
      Vec_IntFill(p,((iVar5 >> 5) + 1) - (uint)((sVar6 & 0x1f) == 0),0);
      uVar7 = 0;
      iVar9 = iVar5;
      if (0 < iVar5) {
        uVar7 = sVar6 & 0xffffffff;
      }
      for (; iVar9 = iVar9 + -1, uVar7 != uVar11; uVar11 = uVar11 + 1) {
        if (pStr[uVar11 + 2] != '0') {
          if (pStr[uVar11 + 2] != '1') goto LAB_002ef763;
          p->pArray[iVar9 >> 5] = p->pArray[iVar9 >> 5] | 1 << ((byte)iVar9 & 0x1f);
        }
      }
    }
LAB_002ef8ef:
    iVar9 = Smt_PrsCreateNode(pNtk,6,0,iVar5,p,pName);
  }
  else {
    if ((byte)(*pStr - 0x30U) < 10) {
      sVar8 = strlen(pStr);
      iVar5 = (int)sVar8;
      p_00 = Vec_IntAlloc(iVar5);
      uVar7 = 0;
      uVar11 = 0;
      if (0 < iVar5) {
        uVar11 = sVar8 & 0xffffffff;
      }
      for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
        Vec_IntPush(p_00,pStr[uVar7] + -0x30);
      }
      p_01 = Vec_IntAlloc(10);
LAB_002ef6d4:
      bVar2 = false;
      iVar9 = 0;
      iVar4 = 0;
LAB_002ef6e0:
      do {
        if (iVar5 <= iVar4) {
LAB_002ef74e:
          Vec_IntFree(p_00);
          if (p_01->nSize != 0) goto LAB_002ef7e4;
          do {
            Vec_IntPush(p_01,0);
LAB_002ef7e4:
          } while ((p_01->nSize & 3U) != 0);
          uVar10 = p_01->nSize >> 2;
          __s = (char *)malloc((long)(int)(uVar10 + 1));
          lVar13 = 0;
          uVar7 = 0;
          if (0 < (int)uVar10) {
            uVar7 = (ulong)uVar10;
          }
          pcVar12 = __s + (int)uVar10;
          for (; pcVar12 = pcVar12 + -1, uVar7 * 4 != lVar13; lVar13 = lVar13 + 4) {
            iVar3 = (int)lVar13;
            iVar5 = Vec_IntEntry(p_01,iVar3);
            iVar9 = Vec_IntEntry(p_01,iVar3 + 1);
            iVar4 = Vec_IntEntry(p_01,iVar3 + 2);
            iVar3 = Vec_IntEntry(p_01,iVar3 + 3);
            uVar1 = iVar5 + iVar9 * 2 + iVar4 * 4 + iVar3 * 8;
            if (0xf < uVar1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                            ,0x23a,"char *Smt_GetHexFromDecimalString(char *)");
            }
            *pcVar12 = (&DAT_0079a66c)[uVar1];
          }
          __s[(int)uVar10] = '\0';
          Vec_IntFree(p_01);
          if (nBits == -1) {
            sVar6 = strlen(__s);
            sVar6 = (size_t)(uint)((int)sVar6 << 2);
          }
          iVar5 = (int)sVar6;
          Vec_IntFill(p,((iVar5 >> 5) + 1) - (uint)((sVar6 & 0x1f) == 0),0);
          Abc_TtReadHexNumber((word *)p->pArray,__s);
          free(__s);
          goto LAB_002ef8ef;
        }
        iVar3 = Vec_IntEntry(p_00,iVar4);
        if (iVar3 != 0 || iVar9 != 0) goto LAB_002ef703;
        iVar4 = iVar4 + 1;
        iVar9 = 0;
      } while (iVar4 < iVar5);
      iVar9 = 0;
      if (!bVar2) goto LAB_002ef74e;
      goto LAB_002ef741;
    }
    iVar9 = Abc_NamStrFindOrAdd(pNtk->pManName,pStr,&fFound);
    if (fFound == 0) {
      __assert_fail("fFound",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                    ,0x272,"int Smt_PrsBuildConstant(Wlc_Ntk_t *, char *, int, char *)");
    }
  }
LAB_002ef907:
  Vec_IntFree(p);
  return iVar9;
LAB_002ef703:
  iVar3 = iVar3 + iVar9 * 10;
  iVar9 = iVar3 % 2;
  Vec_IntWriteEntry(p_00,iVar4,iVar3 / 2);
  iVar4 = iVar4 + 1;
  bVar2 = true;
  if (iVar5 <= iVar4) goto LAB_002ef741;
  goto LAB_002ef6e0;
LAB_002ef741:
  Vec_IntPush(p_01,iVar9);
  goto LAB_002ef6d4;
}

Assistant:

static inline int Smt_PrsBuildConstant( Wlc_Ntk_t * pNtk, char * pStr, int nBits, char * pName )
{
    int i, nDigits, iObj;
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    if ( pStr[0] != '#' ) // decimal
    {
        if ( pStr[0] >= '0' && pStr[0] <= '9' )
        {
            // added: sanity check for large constants
            /*
            Vec_Int_t * temp = Vec_IntAlloc(10);
            int fullBits = -1;
            Smt_GetBinaryFromDecimalString(pStr,temp,&fullBits);
            Vec_IntFree(temp);
            assert(fullBits < 32);*/

            char * pHex = Smt_GetHexFromDecimalString(pStr);
            
            if ( nBits == -1 )
                nBits = strlen(pHex)*4;
            
            //printf("nbits: %d\n",nBits);
            
            Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
            nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pHex );
            ABC_FREE( pHex );
            
            /*
            int w, nWords, Number = atoi( pStr );
            if ( nBits == -1 )
            {
                nBits = Abc_Base2Log( Number+1 );
                assert( nBits < 32 );
            }
            nWords = Abc_BitWordNum( nBits );
            for ( w = 0; w < nWords; w++ )
                Vec_IntPush( vFanins, w ? 0 : Number );
            */
        }
        else
        {
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            Vec_IntFree( vFanins );
            return iObj;
        }
    }
    else if ( pStr[1] == 'b' ) // binary
    {
        if ( nBits == -1 )
            nBits = strlen(pStr+2);
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        for ( i = 0; i < nBits; i++ )
            if ( pStr[2+i] == '1' )
                Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), nBits-1-i );
            else if ( pStr[2+i] != '0' )
            {
                Vec_IntFree( vFanins );
                return 0;
            }
    }
    else if ( pStr[1] == 'x' ) // hexadecimal
    {
        if ( nBits == -1 )
            nBits = strlen(pStr+2)*4;
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pStr+2 );
        if ( nDigits != (nBits + 3)/4 )
        {
            Vec_IntFree( vFanins );
            return 0;
        }
    }
    else 
    {
        Vec_IntFree( vFanins );
        return 0;
    }
    // create constant node
    iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_CONST, 0, nBits, vFanins, pName );
    Vec_IntFree( vFanins );
    return iObj;
}